

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this,
          ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
          *other)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  long *in_RSI;
  long *in_RDI;
  bool dummy [4];
  bool same;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *typed_other;
  GTestLog *in_stack_ffffffffffffff40;
  undefined1 *puVar5;
  bool local_b1;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffff58;
  ParamIterator<(anonymous_namespace)::uniformTileConfigParam> *other_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar6;
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
  *in_stack_ffffffffffffff70;
  bool local_81;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  GTestLog local_1c;
  long *local_18;
  bool local_1;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_18 = in_RSI;
  lVar2 = (**(code **)(*in_RDI + 0x10))();
  lVar3 = (**(code **)(*local_18 + 0x10))();
  bVar1 = IsTrue(lVar2 == lVar3);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (GTestLogSeverity)((ulong)lVar2 >> 0x20),(char *)in_RDI,line);
    poVar4 = GTestLog::GetStream(&local_1c);
    poVar4 = std::operator<<(poVar4,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    in_stack_ffffffffffffff90 =
         (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *)
         std::operator<<(poVar4,"from different generators.");
    std::ostream::operator<<(in_stack_ffffffffffffff90,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(in_stack_ffffffffffffff40);
  }
  CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::uniformTileConfigParam,aom_rc_mode>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>const,testing::internal::ParamIteratorInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::uniformTileConfigParam,aom_rc_mode>>const>
            (in_stack_ffffffffffffff70);
  bVar1 = AtEnd(in_stack_ffffffffffffff90);
  if ((bVar1) && (bVar1 = AtEnd(in_stack_ffffffffffffff90), bVar1)) {
    local_1 = true;
  }
  else {
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x66144d);
    std::
    get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                *)0x661463);
    bVar1 = ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                      ((ParamIterator<const_libaom_test::CodecFactory_*> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    puVar5 = &stack0xffffffffffffffc4;
    local_81 = false;
    if (bVar1) {
      std::
      get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  *)0x6614bc);
      std::
      get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  *)0x6614d2);
      local_81 = ParamIterator<libaom_test::TestMode>::operator==
                           ((ParamIterator<libaom_test::TestMode> *)
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffff58);
    }
    uVar7 = (uint)local_81 << 0x18;
    *puVar5 = local_81;
    other_00 = (ParamIterator<(anonymous_namespace)::uniformTileConfigParam> *)
               &stack0xffffffffffffffc5;
    uVar6 = false;
    if ((uVar7 & 0x1000000) != 0) {
      std::
      get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  *)0x66152c);
      std::
      get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  *)0x661542);
      uVar6 = ParamIterator<(anonymous_namespace)::uniformTileConfigParam>::operator==
                        ((ParamIterator<(anonymous_namespace)::uniformTileConfigParam> *)
                         CONCAT17(uVar6,in_stack_ffffffffffffff60),other_00);
    }
    *(undefined1 *)
     &(other_00->impl_)._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::uniformTileConfigParam>_*,_false>
      ._M_head_impl = uVar6;
    puVar5 = &stack0xffffffffffffffc6;
    local_b1 = false;
    if ((bool)uVar6 != false) {
      std::
      get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  *)0x66159c);
      std::
      get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
                ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                  *)0x6615b1);
      local_b1 = ParamIterator<aom_rc_mode>::operator==
                           ((ParamIterator<aom_rc_mode> *)CONCAT17(uVar6,in_stack_ffffffffffffff60),
                            (ParamIterator<aom_rc_mode> *)other_00);
    }
    *puVar5 = local_b1;
    local_1 = local_b1;
  }
  return local_1;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }